

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O0

void ucnv_fromUnicode_UTF8_OFFSETS_LOGIC_63(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  UConverter *cnv_00;
  UChar *pUVar2;
  byte *pbVar3;
  UBool UVar4;
  byte bVar5;
  int32_t *piVar6;
  byte *pbVar7;
  byte *local_70;
  byte local_64 [4];
  int iStack_60;
  UBool isNotCESU8;
  uint8_t tempBuf [4];
  int32_t indexToWrite;
  int32_t nextSourceIndex;
  int32_t offsetNum;
  UChar32 ch;
  uint8_t *tempPtr;
  uint8_t *targetLimit;
  uint8_t *myTarget;
  UChar *sourceLimit;
  int32_t *myOffsets;
  UChar *mySource;
  UConverter *cnv;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  
  cnv_00 = args->converter;
  myOffsets = (int32_t *)args->source;
  sourceLimit = (UChar *)args->offsets;
  pUVar2 = args->sourceLimit;
  targetLimit = (uint8_t *)args->target;
  pbVar3 = (byte *)args->targetLimit;
  UVar4 = hasCESU8Data(cnv_00);
  if ((cnv_00->fromUChar32 == 0) || (pbVar3 <= targetLimit)) {
    indexToWrite = 0;
    goto LAB_00381e02;
  }
  nextSourceIndex = cnv_00->fromUChar32;
  cnv_00->fromUChar32 = 0;
  indexToWrite = -1;
  tempBuf[0] = '\0';
  tempBuf[1] = '\0';
  tempBuf[2] = '\0';
  tempBuf[3] = '\0';
  do {
    if (pUVar2 <= myOffsets) {
      cnv_00->fromUChar32 = nextSourceIndex;
LAB_0038219a:
      if (((myOffsets < pUVar2) && (pbVar3 <= targetLimit)) &&
         (UVar4 = U_SUCCESS(*err), UVar4 != '\0')) {
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
      args->target = (char *)targetLimit;
      args->source = (UChar *)myOffsets;
      args->offsets = (int32_t *)sourceLimit;
      return;
    }
    if (((nextSourceIndex & 0x400U) != 0) || ((*myOffsets & 0xfc00) != 0xdc00)) {
      cnv_00->fromUChar32 = nextSourceIndex;
      *err = U_ILLEGAL_CHAR_FOUND;
      goto LAB_0038219a;
    }
    nextSourceIndex = nextSourceIndex * 0x400 + (uint)(ushort)*myOffsets + -0x35fdc00;
    tempBuf = (uint8_t  [4])((int)tempBuf + 1);
    myOffsets = (int32_t *)((long)myOffsets + 2);
    do {
      if ((long)pbVar3 - (long)targetLimit < 4) {
        local_70 = local_64;
      }
      else {
        local_70 = targetLimit;
      }
      _offsetNum = local_70;
      bVar5 = (byte)(nextSourceIndex >> 0xc);
      if (nextSourceIndex < 0x10000) {
        iStack_60 = 2;
        *local_70 = bVar5 | 0xe0;
      }
      else {
        iStack_60 = 3;
        *local_70 = (byte)(nextSourceIndex >> 0x12) | 0xf0;
        local_70[1] = bVar5 & 0x3f | 0x80;
      }
      local_70[iStack_60 + -1] = (byte)(nextSourceIndex >> 6) & 0x3f | 0x80;
      local_70[iStack_60] = (byte)nextSourceIndex & 0x3f | 0x80;
      if (local_70 == targetLimit) {
        targetLimit = targetLimit + (iStack_60 + 1);
        *(int32_t *)sourceLimit = indexToWrite;
        *(int32_t *)(sourceLimit + 2) = indexToWrite;
        *(int32_t *)(sourceLimit + 4) = indexToWrite;
        if (2 < iStack_60) {
          *(int32_t *)(sourceLimit + 6) = indexToWrite;
        }
        sourceLimit = sourceLimit + (long)(iStack_60 + 1) * 2;
      }
      else {
        for (; _offsetNum <= local_64 + iStack_60; _offsetNum = _offsetNum + 1) {
          if (targetLimit < pbVar3) {
            *(int32_t *)sourceLimit = indexToWrite;
            *targetLimit = *_offsetNum;
            targetLimit = targetLimit + 1;
            sourceLimit = sourceLimit + 2;
          }
          else {
            bVar5 = *_offsetNum;
            cVar1 = cnv_00->charErrorBufferLength;
            cnv_00->charErrorBufferLength = cVar1 + '\x01';
            cnv_00->charErrorBuffer[cVar1] = bVar5;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
        }
      }
      indexToWrite._0_1_ = tempBuf[0];
      indexToWrite._1_1_ = tempBuf[1];
      indexToWrite._2_1_ = tempBuf[2];
      indexToWrite._3_1_ = tempBuf[3];
LAB_00381e02:
      while( true ) {
        while( true ) {
          if (pUVar2 <= myOffsets || pbVar3 <= targetLimit) goto LAB_0038219a;
          piVar6 = (int32_t *)((long)myOffsets + 2);
          nextSourceIndex = (int32_t)(ushort)*myOffsets;
          bVar5 = (byte)(ushort)*myOffsets;
          myOffsets = piVar6;
          if (0x7f < (uint)nextSourceIndex) break;
          *(int32_t *)sourceLimit = indexToWrite;
          *targetLimit = bVar5;
          indexToWrite = indexToWrite + 1;
          targetLimit = targetLimit + 1;
          sourceLimit = sourceLimit + 2;
        }
        if (0x7ff < (uint)nextSourceIndex) break;
        *(int32_t *)sourceLimit = indexToWrite;
        pbVar7 = targetLimit + 1;
        *targetLimit = (byte)(nextSourceIndex >> 6) | 0xc0;
        if (pbVar7 < pbVar3) {
          *(int32_t *)(sourceLimit + 2) = indexToWrite;
          *pbVar7 = bVar5 & 0x3f | 0x80;
          indexToWrite = indexToWrite + 1;
          targetLimit = targetLimit + 2;
          sourceLimit = sourceLimit + 4;
        }
        else {
          cnv_00->charErrorBuffer[0] = bVar5 & 0x3f | 0x80;
          cnv_00->charErrorBufferLength = '\x01';
          *err = U_BUFFER_OVERFLOW_ERROR;
          targetLimit = pbVar7;
          sourceLimit = sourceLimit + 2;
        }
      }
      tempBuf = (uint8_t  [4])(indexToWrite + 1);
    } while (((nextSourceIndex & 0xfffff800U) != 0xd800) || (UVar4 != '\0'));
  } while( true );
}

Assistant:

U_CFUNC void  U_CALLCONV ucnv_fromUnicode_UTF8_OFFSETS_LOGIC (UConverterFromUnicodeArgs * args,
                                                  UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const UChar *mySource = args->source;
    int32_t *myOffsets = args->offsets;
    const UChar *sourceLimit = args->sourceLimit;
    uint8_t *myTarget = (uint8_t *) args->target;
    const uint8_t *targetLimit = (uint8_t *) args->targetLimit;
    uint8_t *tempPtr;
    UChar32 ch;
    int32_t offsetNum, nextSourceIndex;
    int32_t indexToWrite;
    uint8_t tempBuf[4];
    UBool isNotCESU8 = !hasCESU8Data(cnv);

    if (cnv->fromUChar32 && myTarget < targetLimit)
    {
        ch = cnv->fromUChar32;
        cnv->fromUChar32 = 0;
        offsetNum = -1;
        nextSourceIndex = 0;
        goto lowsurrogate;
    } else {
        offsetNum = 0;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);

        if (ch < 0x80)        /* Single byte */
        {
            *(myOffsets++) = offsetNum++;
            *(myTarget++) = (char) ch;
        }
        else if (ch < 0x800)  /* Double byte */
        {
            *(myOffsets++) = offsetNum;
            *(myTarget++) = (uint8_t) ((ch >> 6) | 0xc0);
            if (myTarget < targetLimit)
            {
                *(myOffsets++) = offsetNum++;
                *(myTarget++) = (uint8_t) ((ch & 0x3f) | 0x80);
            }
            else
            {
                cnv->charErrorBuffer[0] = (uint8_t) ((ch & 0x3f) | 0x80);
                cnv->charErrorBufferLength = 1;
                *err = U_BUFFER_OVERFLOW_ERROR;
            }
        }
        else
        /* Check for surrogates */
        {
            nextSourceIndex = offsetNum + 1;

            if(U16_IS_SURROGATE(ch) && isNotCESU8) {
lowsurrogate:
                if (mySource < sourceLimit) {
                    /* test both code units */
                    if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(*mySource)) {
                        /* convert and consume this supplementary code point */
                        ch=U16_GET_SUPPLEMENTARY(ch, *mySource);
                        ++mySource;
                        ++nextSourceIndex;
                        /* exit this condition tree */
                    }
                    else {
                        /* this is an unpaired trail or lead code unit */
                        /* callback(illegal) */
                        cnv->fromUChar32 = ch;
                        *err = U_ILLEGAL_CHAR_FOUND;
                        break;
                    }
                }
                else {
                    /* no more input */
                    cnv->fromUChar32 = ch;
                    break;
                }
            }

            /* Do we write the buffer directly for speed,
            or do we have to be careful about target buffer space? */
            tempPtr = (((targetLimit - myTarget) >= 4) ? myTarget : tempBuf);

            if (ch <= MAXIMUM_UCS2) {
                indexToWrite = 2;
                tempPtr[0] = (uint8_t) ((ch >> 12) | 0xe0);
            }
            else {
                indexToWrite = 3;
                tempPtr[0] = (uint8_t) ((ch >> 18) | 0xf0);
                tempPtr[1] = (uint8_t) (((ch >> 12) & 0x3f) | 0x80);
            }
            tempPtr[indexToWrite-1] = (uint8_t) (((ch >> 6) & 0x3f) | 0x80);
            tempPtr[indexToWrite] = (uint8_t) ((ch & 0x3f) | 0x80);

            if (tempPtr == myTarget) {
                /* There was enough space to write the codepoint directly. */
                myTarget += (indexToWrite + 1);
                myOffsets[0] = offsetNum;
                myOffsets[1] = offsetNum;
                myOffsets[2] = offsetNum;
                if (indexToWrite >= 3) {
                    myOffsets[3] = offsetNum;
                }
                myOffsets += (indexToWrite + 1);
            }
            else {
                /* We might run out of room soon. Write it slowly. */
                for (; tempPtr <= (tempBuf + indexToWrite); tempPtr++) {
                    if (myTarget < targetLimit)
                    {
                        *(myOffsets++) = offsetNum;
                        *(myTarget++) = *tempPtr;
                    }
                    else
                    {
                        cnv->charErrorBuffer[cnv->charErrorBufferLength++] = *tempPtr;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }
            }
            offsetNum = nextSourceIndex;
        }
    }

    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = (char *) myTarget;
    args->source = mySource;
    args->offsets = myOffsets;
}